

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O0

void __thiscall t_generator::generate_program(t_generator *this)

{
  bool bVar1;
  uint uVar2;
  vector<t_enum_*,_std::allocator<t_enum_*>_> *__x;
  reference pptVar3;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> *__x_00;
  reference pptVar4;
  vector<t_struct_*,_std::allocator<t_struct_*>_> *__x_01;
  reference pptVar5;
  vector<t_const_*,_std::allocator<t_const_*>_> *__x_02;
  vector<t_service_*,_std::allocator<t_service_*>_> *__x_03;
  reference pptVar6;
  string local_140 [32];
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_120
  ;
  t_service **local_118;
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_> local_110
  ;
  iterator sv_iter;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  undefined1 local_d8 [8];
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_> local_b0;
  t_struct **local_a8;
  __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_> local_a0;
  iterator o_iter;
  vector<t_struct_*,_std::allocator<t_struct_*>_> objects;
  __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_> local_70;
  iterator td_iter;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> typedefs;
  __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_40;
  t_enum **local_38;
  __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_30;
  iterator en_iter;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  t_generator *this_local;
  
  (*this->_vptr_t_generator[0xf])();
  __x = t_program::get_enums(this->program_);
  std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector
            ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter,__x);
  __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
  __normal_iterator(&local_30);
  local_38 = (t_enum **)
             std::vector<t_enum_*,_std::allocator<t_enum_*>_>::begin
                       ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
  local_30._M_current = local_38;
  while( true ) {
    local_40._M_current =
         (t_enum **)
         std::vector<t_enum_*,_std::allocator<t_enum_*>_>::end
                   ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (!bVar1) break;
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
              operator*(&local_30);
    (*this->_vptr_t_generator[0x13])(this,*pptVar3);
    __gnu_cxx::__normal_iterator<t_enum_**,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
    operator++(&local_30);
  }
  __x_00 = t_program::get_typedefs(this->program_);
  std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
            ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter,__x_00);
  __gnu_cxx::
  __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
  __normal_iterator(&local_70);
  local_70._M_current =
       (t_typedef **)
       std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::begin
                 ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
  while( true ) {
    objects.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::end
                            ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_70,
                       (__normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
                        *)&objects.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>
              ::operator*(&local_70);
    (*this->_vptr_t_generator[0x12])(this,*pptVar4);
    __gnu_cxx::
    __normal_iterator<t_typedef_**,_std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>_>::
    operator++(&local_70);
  }
  __x_01 = t_program::get_objects(this->program_);
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector
            ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter,__x_01);
  __gnu_cxx::__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>::
  __normal_iterator(&local_a0);
  local_a8 = (t_struct **)
             std::vector<t_struct_*,_std::allocator<t_struct_*>_>::begin
                       ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
  local_a0._M_current = local_a8;
  while( true ) {
    local_b0._M_current =
         (t_struct **)
         std::vector<t_struct_*,_std::allocator<t_struct_*>_>::end
                   ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
    bVar1 = __gnu_cxx::operator!=(&local_a0,&local_b0);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
              ::operator*(&local_a0);
    (*this->_vptr_t_generator[0x17])(this,*pptVar5);
    __gnu_cxx::__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
    ::operator++(&local_a0);
  }
  local_a0._M_current =
       (t_struct **)
       std::vector<t_struct_*,_std::allocator<t_struct_*>_>::begin
                 ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
  while( true ) {
    consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage =
         (pointer)std::vector<t_struct_*,_std::allocator<t_struct_*>_>::end
                            ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
    bVar1 = __gnu_cxx::operator!=
                      (&local_a0,
                       (__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                        *)&consts.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
              ::operator*(&local_a0);
    uVar2 = (*((*pptVar5)->super_t_type).super_t_doc._vptr_t_doc[0xc])();
    if ((uVar2 & 1) == 0) {
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                ::operator*(&local_a0);
      (*this->_vptr_t_generator[0x15])(this,*pptVar5);
    }
    else {
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
                ::operator*(&local_a0);
      (*this->_vptr_t_generator[0x18])(this,*pptVar5);
    }
    __gnu_cxx::__normal_iterator<t_struct_**,_std::vector<t_struct_*,_std::allocator<t_struct_*>_>_>
    ::operator++(&local_a0);
  }
  __x_02 = t_program::get_consts(this->program_);
  std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
            ((vector<t_const_*,_std::allocator<t_const_*>_> *)local_d8,__x_02);
  std::vector<t_const_*,_std::allocator<t_const_*>_>::vector
            ((vector<t_const_*,_std::allocator<t_const_*>_> *)
             &services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<t_const_*,_std::allocator<t_const_*>_> *)local_d8);
  (*this->_vptr_t_generator[0x11])
            (this,&services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  std::vector<t_const_*,_std::allocator<t_const_*>_>::~vector
            ((vector<t_const_*,_std::allocator<t_const_*>_> *)
             &services.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __x_03 = t_program::get_services(this->program_);
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
            ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter,__x_03);
  __gnu_cxx::
  __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
  __normal_iterator(&local_110);
  local_118 = (t_service **)
              std::vector<t_service_*,_std::allocator<t_service_*>_>::begin
                        ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
  local_110._M_current = local_118;
  while( true ) {
    local_120._M_current =
         (t_service **)
         std::vector<t_service_*,_std::allocator<t_service_*>_>::end
                   ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
    bVar1 = __gnu_cxx::operator!=(&local_110,&local_120);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
              ::operator*(&local_110);
    (*this->_vptr_t_generator[0x1a])(local_140,this,*pptVar6);
    std::__cxx11::string::operator=((string *)&this->service_name_,local_140);
    std::__cxx11::string::~string(local_140);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>
              ::operator*(&local_110);
    (*this->_vptr_t_generator[0x16])(this,*pptVar6);
    __gnu_cxx::
    __normal_iterator<t_service_**,_std::vector<t_service_*,_std::allocator<t_service_*>_>_>::
    operator++(&local_110);
  }
  (*this->_vptr_t_generator[0x10])();
  std::vector<t_service_*,_std::allocator<t_service_*>_>::~vector
            ((vector<t_service_*,_std::allocator<t_service_*>_> *)&sv_iter);
  std::vector<t_const_*,_std::allocator<t_const_*>_>::~vector
            ((vector<t_const_*,_std::allocator<t_const_*>_> *)local_d8);
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::~vector
            ((vector<t_struct_*,_std::allocator<t_struct_*>_> *)&o_iter);
  std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::~vector
            ((vector<t_typedef_*,_std::allocator<t_typedef_*>_> *)&td_iter);
  std::vector<t_enum_*,_std::allocator<t_enum_*>_>::~vector
            ((vector<t_enum_*,_std::allocator<t_enum_*>_> *)&en_iter);
  return;
}

Assistant:

void t_generator::generate_program() {
  // Initialize the generator
  init_generator();

  // Generate enums
  vector<t_enum*> enums = program_->get_enums();
  vector<t_enum*>::iterator en_iter;
  for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
    generate_enum(*en_iter);
  }

  // Generate typedefs
  vector<t_typedef*> typedefs = program_->get_typedefs();
  vector<t_typedef*>::iterator td_iter;
  for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
    generate_typedef(*td_iter);
  }

  // Generate structs, exceptions, and unions in declared order
  vector<t_struct*> objects = program_->get_objects();

  vector<t_struct*>::iterator o_iter;
  for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
    generate_forward_declaration(*o_iter);
  }
  for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
    if ((*o_iter)->is_xception()) {
      generate_xception(*o_iter);
    } else {
      generate_struct(*o_iter);
    }
  }

  // Generate constants
  vector<t_const*> consts = program_->get_consts();
  generate_consts(consts);

  // Generate services
  vector<t_service*> services = program_->get_services();
  vector<t_service*>::iterator sv_iter;
  for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
    service_name_ = get_service_name(*sv_iter);
    generate_service(*sv_iter);
  }

  // Close the generator
  close_generator();
}